

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sampleInsert(Stat4Accum *p,Stat4Sample *pNew,int nEqZero)

{
  tRowcnt *ptVar1;
  tRowcnt *ptVar2;
  tRowcnt *ptVar3;
  int iVar4;
  long lVar5;
  Stat4Sample *pSVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  Stat4Sample *pSVar11;
  ulong uVar12;
  
  if (p->nMaxEqZero < nEqZero) {
    p->nMaxEqZero = nEqZero;
  }
  uVar10 = p->nSample;
  uVar8 = (ulong)uVar10;
  if (pNew->isPSample != '\0') {
LAB_00182c67:
    pSVar11 = p->a;
    if (p->mxSample <= (int)uVar10) {
      iVar4 = p->iMin;
      pSVar6 = pSVar11 + iVar4;
      ptVar1 = pSVar6->anLt;
      ptVar2 = pSVar6->anEq;
      ptVar3 = pSVar6->anDLt;
      sampleClear(p->db,pSVar11 + iVar4);
      memmove(pSVar11 + iVar4,pSVar6 + 1,(long)(~p->iMin + p->nSample) * 0x30);
      pSVar11 = p->a;
      lVar5 = (long)p->nSample;
      pSVar11[lVar5 + -1].nRowid = 0;
      pSVar11[lVar5 + -1].anEq = ptVar2;
      pSVar11[lVar5 + -1].anDLt = ptVar3;
      pSVar11[lVar5 + -1].anLt = ptVar1;
      uVar10 = p->mxSample - 1;
      p->nSample = uVar10;
    }
    sampleCopy(p,pSVar11 + (int)uVar10,pNew);
    p->nSample = p->nSample + 1;
    memset(pSVar11[(int)uVar10].anEq,0,(long)nEqZero << 2);
LAB_00182d18:
    uVar10 = p->mxSample;
    if ((int)uVar10 <= p->nSample) {
      uVar12 = 0;
      uVar8 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar8 = uVar12;
      }
      uVar7 = 0xffffffffffffffff;
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        pSVar11 = p->a;
        if (((&pSVar11->isPSample)[uVar12] == '\0') &&
           (((int)uVar7 < 0 ||
            (iVar4 = sampleIsBetter(p,pSVar11 + (uVar7 & 0xffffffff),
                                    (Stat4Sample *)((long)&pSVar11->anEq + uVar12)), iVar4 != 0))))
        {
          uVar7 = uVar9 & 0xffffffff;
        }
        uVar12 = uVar12 + 0x30;
      }
      p->iMin = (int)uVar7;
    }
    return;
  }
  pSVar11 = (Stat4Sample *)0x0;
LAB_00182d8c:
  pSVar6 = pSVar11;
  uVar12 = uVar8 & 0xffffffff;
  lVar5 = uVar8 * 0x30;
  do {
    uVar8 = uVar8 - 1;
    if ((int)uVar12 < 1) {
      if (pSVar6 == (Stat4Sample *)0x0) goto LAB_00182c67;
      iVar4 = pNew->iCol;
      pSVar6->iCol = iVar4;
      pSVar6->anEq[iVar4] = pNew->anEq[iVar4];
      goto LAB_00182d18;
    }
    pSVar11 = p->a;
    if (*(int *)(*(long *)((long)&pSVar11[-1].anEq + lVar5) + (long)pNew->iCol * 4) == 0) {
      if ((&pSVar11[-1].isPSample)[lVar5] != '\0') {
        return;
      }
      pSVar11 = (Stat4Sample *)((long)&pSVar11[-1].anEq + lVar5);
      if ((pSVar6 == (Stat4Sample *)0x0) || (iVar4 = sampleIsBetter(p,pSVar11,pSVar6), iVar4 != 0))
      goto LAB_00182d8c;
    }
    uVar12 = (ulong)((int)uVar12 - 1);
    lVar5 = lVar5 + -0x30;
  } while( true );
}

Assistant:

static void sampleInsert(Stat4Accum *p, Stat4Sample *pNew, int nEqZero){
  Stat4Sample *pSample = 0;
  int i;

  assert( IsStat4 || nEqZero==0 );

#ifdef SQLITE_ENABLE_STAT4
  /* Stat4Accum.nMaxEqZero is set to the maximum number of leading 0
  ** values in the anEq[] array of any sample in Stat4Accum.a[]. In
  ** other words, if nMaxEqZero is n, then it is guaranteed that there
  ** are no samples with Stat4Sample.anEq[m]==0 for (m>=n). */
  if( nEqZero>p->nMaxEqZero ){
    p->nMaxEqZero = nEqZero;
  }
  if( pNew->isPSample==0 ){
    Stat4Sample *pUpgrade = 0;
    assert( pNew->anEq[pNew->iCol]>0 );

    /* This sample is being added because the prefix that ends in column 
    ** iCol occurs many times in the table. However, if we have already
    ** added a sample that shares this prefix, there is no need to add
    ** this one. Instead, upgrade the priority of the highest priority
    ** existing sample that shares this prefix.  */
    for(i=p->nSample-1; i>=0; i--){
      Stat4Sample *pOld = &p->a[i];
      if( pOld->anEq[pNew->iCol]==0 ){
        if( pOld->isPSample ) return;
        assert( pOld->iCol>pNew->iCol );
        assert( sampleIsBetter(p, pNew, pOld) );
        if( pUpgrade==0 || sampleIsBetter(p, pOld, pUpgrade) ){
          pUpgrade = pOld;
        }
      }
    }
    if( pUpgrade ){
      pUpgrade->iCol = pNew->iCol;
      pUpgrade->anEq[pUpgrade->iCol] = pNew->anEq[pUpgrade->iCol];
      goto find_new_min;
    }
  }
#endif

  /* If necessary, remove sample iMin to make room for the new sample. */
  if( p->nSample>=p->mxSample ){
    Stat4Sample *pMin = &p->a[p->iMin];
    tRowcnt *anEq = pMin->anEq;
    tRowcnt *anLt = pMin->anLt;
    tRowcnt *anDLt = pMin->anDLt;
    sampleClear(p->db, pMin);
    memmove(pMin, &pMin[1], sizeof(p->a[0])*(p->nSample-p->iMin-1));
    pSample = &p->a[p->nSample-1];
    pSample->nRowid = 0;
    pSample->anEq = anEq;
    pSample->anDLt = anDLt;
    pSample->anLt = anLt;
    p->nSample = p->mxSample-1;
  }

  /* The "rows less-than" for the rowid column must be greater than that
  ** for the last sample in the p->a[] array. Otherwise, the samples would
  ** be out of order. */
#ifdef SQLITE_ENABLE_STAT4
  assert( p->nSample==0 
       || pNew->anLt[p->nCol-1] > p->a[p->nSample-1].anLt[p->nCol-1] );
#endif

  /* Insert the new sample */
  pSample = &p->a[p->nSample];
  sampleCopy(p, pSample, pNew);
  p->nSample++;

  /* Zero the first nEqZero entries in the anEq[] array. */
  memset(pSample->anEq, 0, sizeof(tRowcnt)*nEqZero);

#ifdef SQLITE_ENABLE_STAT4
 find_new_min:
#endif
  if( p->nSample>=p->mxSample ){
    int iMin = -1;
    for(i=0; i<p->mxSample; i++){
      if( p->a[i].isPSample ) continue;
      if( iMin<0 || sampleIsBetter(p, &p->a[iMin], &p->a[i]) ){
        iMin = i;
      }
    }
    assert( iMin>=0 );
    p->iMin = iMin;
  }
}